

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::addColorBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::TextureBuffer> *textureBufferIn)

{
  bool bVar1;
  GLenum GVar2;
  TextureBufferHandle TVar3;
  runtime_error *this_00;
  element_type *peVar4;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  long *in_RDI;
  undefined1 in_stack_00000047;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer> textureBuffer;
  value_type *__x;
  vector<std::shared_ptr<polyscope::render::TextureBuffer>,_std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>_>_>
  *this_01;
  PFNGLFRAMEBUFFERTEXTURE2DPROC p_Var5;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<std::shared_ptr<polyscope::render::TextureBuffer>,_std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>_>_>
  local_40;
  __shared_ptr local_20 [32];
  
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,polyscope::render::TextureBuffer>
            ((shared_ptr<polyscope::render::TextureBuffer> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"tried to bind to non-GL texture buffer");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar4 = std::
           __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3dd6ba);
  GLTextureBuffer::bind(peVar4,in_ESI,__addr,in_ECX);
  (**(code **)(*in_RDI + 0x10))();
  checkGLError((bool)in_stack_00000047);
  p_Var5 = glad_glFramebufferTexture2D;
  GVar2 = colorAttachNum((uint)glad_glFramebufferTexture2D);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3dd70c);
  TVar3 = GLTextureBuffer::getHandle(peVar4);
  (*p_Var5)(0x8d40,GVar2,0xde1,TVar3,0);
  checkGLError((bool)in_stack_00000047);
  __x = (value_type *)(in_RDI + 0xe);
  this_01 = &local_40;
  std::shared_ptr<polyscope::render::TextureBuffer>::
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,void>
            ((shared_ptr<polyscope::render::TextureBuffer> *)this_01,
             (shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer> *)__x);
  std::
  vector<std::shared_ptr<polyscope::render::TextureBuffer>,_std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>_>_>
  ::push_back(this_01,__x);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x3dd77f);
  *(int *)(in_RDI + 7) = (int)in_RDI[7] + 1;
  std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer> *)0x3dd797);
  return;
}

Assistant:

void GLFrameBuffer::addColorBuffer(std::shared_ptr<TextureBuffer> textureBufferIn) {

  // it _better_ be a GL buffer
  std::shared_ptr<GLTextureBuffer> textureBuffer = std::dynamic_pointer_cast<GLTextureBuffer>(textureBufferIn);
  if (!textureBuffer) throw std::runtime_error("tried to bind to non-GL texture buffer");

  textureBuffer->bind();
  bind();
  checkGLError();

  glFramebufferTexture2D(GL_FRAMEBUFFER, colorAttachNum(nColorBuffers), GL_TEXTURE_2D, textureBuffer->getHandle(), 0);

  checkGLError();
  textureBuffersColor.push_back(textureBuffer);
  nColorBuffers++;
}